

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * funcnamefromcall(lua_State *L,CallInfo *ci,char **name)

{
  Proto *p;
  int pc;
  char **name_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  if ((ci->callstatus & 8) == 0) {
    if ((ci->callstatus & 0x80) == 0) {
      if ((ci->callstatus & 2) == 0) {
        p = *(Proto **)((((ci->func).p)->val).value_.f + 0x18);
        pc = currentpc(ci);
        L_local = (lua_State *)funcnamefromcode(L,p,pc,name);
      }
      else {
        L_local = (lua_State *)0x0;
      }
    }
    else {
      *name = "__gc";
      L_local = (lua_State *)anon_var_dwarf_b267b;
    }
  }
  else {
    *name = "?";
    L_local = (lua_State *)0x1b1ba2;
  }
  return (char *)L_local;
}

Assistant:

static const char *funcnamefromcall (lua_State *L, CallInfo *ci,
                                                   const char **name) {
  if (ci->callstatus & CIST_HOOKED) {  /* was it called inside a hook? */
    *name = "?";
    return "hook";
  }
  else if (ci->callstatus & CIST_FIN) {  /* was it called as a finalizer? */
    *name = "__gc";
    return "metamethod";  /* report it as such */
  }
  else if (isLua(ci))
    return funcnamefromcode(L, ci_func(ci)->p, currentpc(ci), name);
  else
    return NULL;
}